

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

void __thiscall hrgls::Message::Message(Message *this,Message *copy)

{
  hrgls_Status hVar1;
  Message_private *pMVar2;
  hrgls_Message MessageToCopy;
  Message *copy_local;
  Message *this_local;
  
  this->m_private = (Message_private *)0x0;
  pMVar2 = (Message_private *)operator_new(0x10);
  memset(pMVar2,0,0x10);
  Message_private::Message_private(pMVar2);
  this->m_private = pMVar2;
  pMVar2 = this->m_private;
  MessageToCopy = RawMessage(copy);
  hVar1 = hrgls_MessageCopy(&pMVar2->Message,MessageToCopy);
  this->m_private->status = hVar1;
  return;
}

Assistant:

Message::Message(const Message &copy)
  {
    m_private = new Message_private();
    m_private->status = hrgls_MessageCopy(&m_private->Message, copy.RawMessage());
  }